

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O3

int __thiscall
LiteScript::Syntax::ReadReturn
          (Syntax *this,char *text,
          vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
          ErrorType *errorType)

{
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *pvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint i;
  int iVar5;
  string keyword;
  Instruction local_70;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *local_60;
  int local_54;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  uVar2 = ReadName((char *)this,&local_50);
  iVar5 = 0;
  if (uVar2 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    iVar5 = 0;
    if (iVar3 == 0) {
      uVar2 = 0;
      local_60 = instrl;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)this[(ulong)uVar2 + 6]) ||
             ((0x100000600U >> ((ulong)(byte)this[(ulong)uVar2 + 6] & 0x3f) & 1) == 0)) break;
          uVar2 = uVar2 + 1;
        }
        uVar4 = ReadComment((char *)(this + (ulong)uVar2 + 6));
        if (uVar4 == 0) break;
        uVar2 = uVar2 + uVar4;
      }
      if (this[(long)(int)uVar2 + 6] == (Syntax)0x3b) {
        Instruction::Instruction(&local_70,INSTR_RETURN);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>
                  ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)text
                   ,&local_70);
        Instruction::~Instruction(&local_70);
        iVar5 = uVar2 + 7;
      }
      else {
        iVar5 = ReadExpression(this + (long)(int)uVar2 + 6,text,local_60,errorType);
        if (iVar5 < 1) {
          if (iVar5 == 0) {
            *(undefined4 *)
             &(local_60->
              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)
              ._M_impl.super__Vector_impl_data._M_start = 0x1f;
            iVar5 = -6 - uVar2;
          }
          else {
            iVar5 = iVar5 - (uVar2 + 6);
          }
        }
        else {
          iVar5 = iVar5 + uVar2 + 6;
          uVar2 = 0;
          local_54 = iVar5;
          while( true ) {
            while( true ) {
              if ((0x20 < (ulong)(byte)this[(ulong)uVar2 + (long)iVar5]) ||
                 ((0x100000600U >> ((ulong)(byte)this[(ulong)uVar2 + (long)iVar5] & 0x3f) & 1) == 0)
                 ) break;
              uVar2 = uVar2 + 1;
            }
            uVar4 = ReadComment((char *)(this + (ulong)uVar2 + (long)iVar5));
            if (uVar4 == 0) break;
            uVar2 = uVar2 + uVar4;
          }
          Instruction::Instruction(&local_70,INSTR_DEFINE_RETURN);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
          emplace_back<LiteScript::Instruction>
                    ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                     text,&local_70);
          iVar5 = local_54;
          pvVar1 = local_60;
          Instruction::~Instruction(&local_70);
          Instruction::Instruction(&local_70,INSTR_RETURN);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
          emplace_back<LiteScript::Instruction>
                    ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                     text,&local_70);
          iVar5 = uVar2 + iVar5;
          Instruction::~Instruction(&local_70);
          if (this[iVar5] == (Syntax)0x3b) {
            iVar5 = iVar5 + 1;
          }
          else {
            *(undefined4 *)
             &(pvVar1->
              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)
              ._M_impl.super__Vector_impl_data._M_start = 0x1d;
            iVar5 = -iVar5;
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

int LiteScript::Syntax::ReadReturn(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "return")
        return 0;
    int i = 6;
    i += (int)ReadWhitespace(text + i);
    if (text[i] == ';') {
        instrl.push_back(Instruction(InstrCode::INSTR_RETURN));
        return i + 1;
    }
    int tmp;
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_RETURN;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_DEFINE_RETURN));
    instrl.push_back(Instruction(InstrCode::INSTR_RETURN));
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return -i;
    }
    return i + 1;
}